

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowsetbase.h
# Opt level: O2

SVectorBase<double> * __thiscall
soplex::LPRowSetBase<double>::create
          (LPRowSetBase<double> *this,DataKey *newkey,int nonzeros,double *newlhs,double *newrhs,
          double *newobj,int *newscaleExp)

{
  pointer pdVar1;
  SVectorBase<double> *pSVar2;
  int iVar3;
  
  iVar3 = (this->super_SVSetBase<double>).set.thenum;
  pdVar1 = (this->left).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->left).val.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1) >> 3) <= iVar3)
  {
    VectorBase<double>::reDim(&this->left,iVar3 + 1,true);
    VectorBase<double>::reDim(&this->right,(this->super_SVSetBase<double>).set.thenum + 1,true);
    VectorBase<double>::reDim(&this->object,(this->super_SVSetBase<double>).set.thenum + 1,true);
    DataArray<int>::reSize(&this->scaleExp,(this->super_SVSetBase<double>).set.thenum + 1);
    iVar3 = (this->super_SVSetBase<double>).set.thenum;
    pdVar1 = (this->left).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  pdVar1[iVar3] = *newlhs;
  (this->right).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[iVar3] = *newrhs;
  (this->object).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[iVar3] = *newobj;
  (this->scaleExp).data[iVar3] = *newscaleExp;
  pSVar2 = SVSetBase<double>::create(&this->super_SVSetBase<double>,newkey,nonzeros);
  return pSVar2;
}

Assistant:

SVectorBase<R>& create(DataKey& newkey, int nonzeros = 0, const R& newlhs = 0, const R& newrhs = 1,
                          const R& newobj = 0, const int& newscaleExp = 0)
   {
      if(num() + 1 > left.dim())
      {
         left.reDim(num() + 1);
         right.reDim(num() + 1);
         object.reDim(num() + 1);
         scaleExp.reSize(num() + 1);
      }

      left[num()] = newlhs;
      right[num()] = newrhs;
      object[num()] = newobj;
      scaleExp[num()] = newscaleExp;

      return *SVSetBase<R>::create(newkey, nonzeros);
   }